

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSubSimplexConvexCast.cpp
# Opt level: O1

bool __thiscall
btSubsimplexConvexCast::calcTimeOfImpact
          (btSubsimplexConvexCast *this,btTransform *fromA,btTransform *toA,btTransform *fromB,
          btTransform *toB,CastResult *result)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btVector3 bVar4;
  CastResult *pCVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  float fVar9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar10 [16];
  btScalar bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  btVector3 hitA;
  btVector3 hitB;
  btVector3 local_250;
  btScalar local_240;
  btScalar local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  btVector3 local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  btVector3 local_1f8;
  float local_1e8;
  btScalar bStack_1e4;
  undefined8 uStack_1e0;
  float local_1d8 [4];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  CastResult *local_178;
  btTransform *local_170;
  btVector3 local_168;
  btVector3 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  btVector3 local_40;
  
  local_178 = result;
  btVoronoiSimplexSolver::reset(this->m_simplexSolver);
  fVar15 = (fromA->m_origin).m_floats[0];
  local_188 = ZEXT416((uint)fVar15);
  local_c8 = *(undefined8 *)((fromA->m_origin).m_floats + 1);
  uStack_c0 = 0;
  fVar9 = (fromB->m_origin).m_floats[0];
  _local_228 = ZEXT416((uint)fVar9);
  local_208 = *(undefined8 *)((fromB->m_origin).m_floats + 1);
  uStack_200 = 0;
  fVar13 = (fromA->m_basis).m_el[0].m_floats[2];
  local_d8 = ZEXT416((uint)fVar13);
  local_e8 = *(undefined8 *)(fromA->m_basis).m_el[0].m_floats;
  uStack_e0 = 0;
  local_f8 = *(undefined8 *)(fromA->m_basis).m_el[1].m_floats;
  uStack_f0 = 0;
  local_a8 = *(undefined8 *)(fromA->m_basis).m_el[2].m_floats;
  fVar15 = ((toA->m_origin).m_floats[0] - fVar15) - ((toB->m_origin).m_floats[0] - fVar9);
  local_1a8 = ZEXT416((uint)fVar15);
  local_238._0_4_ =
       ((toA->m_origin).m_floats[1] - (float)local_c8) -
       ((toB->m_origin).m_floats[1] - (float)local_208);
  local_1c8 = ZEXT416((uint)(float)local_238);
  local_198 = ((toA->m_origin).m_floats[2] - (float)((ulong)local_c8 >> 0x20)) -
              ((toB->m_origin).m_floats[2] - (float)((ulong)local_208 >> 0x20));
  local_1b8 = ZEXT416((uint)local_198);
  fVar15 = -fVar15;
  uStack_230 = CONCAT44((float)local_238,(float)local_238);
  uStack_a0 = 0;
  local_250.m_floats[0] =
       (fVar15 * (float)local_e8 - (float)local_f8 * (float)local_238) - (float)local_a8 * local_198
  ;
  local_250.m_floats[1] =
       (fVar15 * (float)((ulong)local_e8 >> 0x20) -
       (fromA->m_basis).m_el[1].m_floats[1] * (float)local_238) -
       (fromA->m_basis).m_el[2].m_floats[1] * local_198;
  local_108 = ZEXT416((uint)(fromA->m_basis).m_el[1].m_floats[2]);
  local_250.m_floats[2] =
       (fVar15 * fVar13 - (fromA->m_basis).m_el[1].m_floats[2] * (float)local_238) -
       (fromA->m_basis).m_el[2].m_floats[2] * local_198;
  local_250.m_floats[3] = 0.0;
  local_23c = (fromA->m_basis).m_el[2].m_floats[2];
  local_118 = ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[2]);
  local_128 = ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[2]);
  local_138 = *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  uStack_130 = 0;
  local_148 = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  uStack_140 = 0;
  local_b8 = *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  uStack_b0 = 0;
  bVar11 = (fromB->m_basis).m_el[2].m_floats[2];
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  local_1d8[3] = 0.0;
  local_240 = bVar11;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  local_170 = toB;
  local_238._4_4_ = (float)local_238;
  (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[0x10])
            (this->m_convexA,&local_250);
  fVar15 = (float)extraout_XMM0_Qa;
  fVar9 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  uVar1 = *(undefined8 *)(fromA->m_origin).m_floats;
  local_1f8.m_floats[0] =
       (float)uVar1 +
       (fromA->m_basis).m_el[0].m_floats[2] * bVar11 +
       (fromA->m_basis).m_el[0].m_floats[0] * fVar15 + (fromA->m_basis).m_el[0].m_floats[1] * fVar9;
  local_1f8.m_floats[1] =
       (float)((ulong)uVar1 >> 0x20) +
       (fromA->m_basis).m_el[1].m_floats[2] * bVar11 +
       (fromA->m_basis).m_el[1].m_floats[0] * fVar15 + (fromA->m_basis).m_el[1].m_floats[1] * fVar9;
  local_1f8.m_floats[2] =
       (fromA->m_basis).m_el[2].m_floats[2] * bVar11 +
       (fromA->m_basis).m_el[2].m_floats[0] * fVar15 + (fromA->m_basis).m_el[2].m_floats[1] * fVar9
       + (fromA->m_origin).m_floats[2];
  local_1f8.m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  uVar2 = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  uVar3 = *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  fVar15 = (fromB->m_basis).m_el[2].m_floats[2] * (float)local_1b8._0_4_ +
           (fromB->m_basis).m_el[0].m_floats[2] * (float)local_1a8._0_4_ +
           (fromB->m_basis).m_el[1].m_floats[2] * (float)local_1c8._0_4_;
  local_250.m_floats[1] =
       (float)((ulong)uVar3 >> 0x20) * fStack_194 +
       (float)local_1a8._0_4_ * (float)((ulong)uVar1 >> 0x20) +
       (float)((ulong)uVar2 >> 0x20) * local_238._4_4_;
  local_250.m_floats[0] =
       (float)uVar3 * local_198 +
       (float)local_1a8._0_4_ * (float)uVar1 + (float)uVar2 * (float)local_238;
  local_250.m_floats[2] = fVar15;
  local_250.m_floats[3] = 0.0;
  (*(this->m_convexB->super_btCollisionShape)._vptr_btCollisionShape[0x10])
            (this->m_convexB,&local_250);
  fVar9 = (float)extraout_XMM0_Qa_00;
  fVar13 = (float)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uVar1 = *(undefined8 *)(fromB->m_origin).m_floats;
  fVar12 = (float)uVar1 +
           (fromB->m_basis).m_el[0].m_floats[2] * fVar15 +
           (fromB->m_basis).m_el[0].m_floats[0] * fVar9 +
           (fromB->m_basis).m_el[0].m_floats[1] * fVar13;
  fVar14 = (float)((ulong)uVar1 >> 0x20) +
           (fromB->m_basis).m_el[1].m_floats[2] * fVar15 +
           (fromB->m_basis).m_el[1].m_floats[0] * fVar9 +
           (fromB->m_basis).m_el[1].m_floats[1] * fVar13;
  fVar15 = (fromB->m_basis).m_el[2].m_floats[2] * fVar15 +
           (fromB->m_basis).m_el[2].m_floats[0] * fVar9 +
           (fromB->m_basis).m_el[2].m_floats[1] * fVar13 + (fromB->m_origin).m_floats[2];
  local_158.m_floats[1] = fVar14;
  local_158.m_floats[0] = fVar12;
  local_158.m_floats[2] = fVar15;
  local_158.m_floats[3] = 0.0;
  fVar15 = local_1f8.m_floats[2] - fVar15;
  local_250.m_floats[0] = local_1f8.m_floats[0] - fVar12;
  local_250.m_floats[1] = local_1f8.m_floats[1] - fVar14;
  local_250.m_floats[2] = fVar15;
  local_250.m_floats[3] = 0.0;
  fVar15 = fVar15 * fVar15 +
           local_250.m_floats[0] * local_250.m_floats[0] +
           local_250.m_floats[1] * local_250.m_floats[1];
  local_228._4_4_ = (float)local_208;
  fStack_220 = (float)local_208._4_4_;
  fStack_21c = (float)local_188._0_4_;
  local_198 = (float)local_d8._0_4_;
  fStack_194 = (float)local_108._0_4_;
  fStack_190 = (float)local_d8._4_4_;
  fStack_18c = (float)local_108._4_4_;
  local_58 = (float)local_e8;
  fStack_54 = (float)local_f8;
  fStack_50 = local_e8._4_4_;
  fStack_4c = local_f8._4_4_;
  local_68 = local_e8._4_4_;
  fStack_64 = local_f8._4_4_;
  uStack_60 = (undefined4)uStack_e0;
  uStack_5c = uStack_e0._4_4_;
  local_78 = (float)local_118._0_4_;
  fStack_74 = (float)local_128._0_4_;
  uStack_70 = local_118._4_4_;
  uStack_6c = local_128._4_4_;
  local_88 = (float)local_138;
  fStack_84 = (float)local_148;
  fStack_80 = local_138._4_4_;
  fStack_7c = local_148._4_4_;
  local_98 = local_138._4_4_;
  fStack_94 = local_148._4_4_;
  uStack_90 = (undefined4)uStack_130;
  uStack_8c = uStack_130._4_4_;
  iVar8 = -0x21;
  local_1e8 = 0.0;
  bStack_1e4 = 0.0;
  uStack_1e0 = 0;
  local_238 = 0;
  uStack_230 = 0;
  do {
    pCVar5 = local_178;
    if ((fVar15 <= 0.0001) || (iVar8 = iVar8 + 1, iVar8 == 0)) {
      local_178->m_fraction = (float)local_238;
      fVar15 = local_1e8 * local_1e8 + local_1d8[0] * local_1d8[0] + local_1d8[1] * local_1d8[1];
      if (1.4210855e-14 <= fVar15) {
        if (fVar15 < 0.0) {
          fVar15 = sqrtf(fVar15);
        }
        else {
          fVar15 = SQRT(fVar15);
        }
        fVar15 = 1.0 / fVar15;
        (pCVar5->m_normal).m_floats[0] = local_1d8[0] * fVar15;
        (pCVar5->m_normal).m_floats[1] = local_1d8[1] * fVar15;
        (pCVar5->m_normal).m_floats[2] = local_1e8 * fVar15;
        (pCVar5->m_normal).m_floats[3] = bStack_1e4;
      }
      else {
        auVar10._0_12_ = ZEXT812(0);
        auVar10._12_4_ = 0;
        *(undefined1 (*) [16])(local_178->m_normal).m_floats = auVar10;
      }
      if (-pCVar5->m_allowedPenetration <=
          (float)local_1b8._0_4_ * (pCVar5->m_normal).m_floats[2] +
          (float)local_1a8._0_4_ * (pCVar5->m_normal).m_floats[0] +
          (float)local_1c8._0_4_ * (pCVar5->m_normal).m_floats[1]) {
        return false;
      }
      btVoronoiSimplexSolver::compute_points(this->m_simplexSolver,&local_168,&local_40);
      *(undefined8 *)(pCVar5->m_hitPoint).m_floats = local_40.m_floats._0_8_;
      *(undefined8 *)((pCVar5->m_hitPoint).m_floats + 2) = local_40.m_floats._8_8_;
      return true;
    }
    local_208 = CONCAT44(local_208._4_4_,fVar15);
    fVar15 = (float)((uint)local_250.m_floats[0] ^ (uint)DAT_001f5270);
    fVar9 = (fVar15 * (float)local_d8._0_4_ - (float)local_108._0_4_ * local_250.m_floats[1]) -
            local_23c * local_250.m_floats[2];
    local_168.m_floats[1] =
         (fVar15 * local_e8._4_4_ - local_250.m_floats[1] * local_f8._4_4_) -
         local_250.m_floats[2] * local_a8._4_4_;
    local_168.m_floats[0] =
         (fVar15 * (float)local_e8 - local_250.m_floats[1] * (float)local_f8) -
         local_250.m_floats[2] * (float)local_a8;
    local_168.m_floats[2] = fVar9;
    local_168.m_floats[3] = 0.0;
    (*(this->m_convexA->super_btCollisionShape)._vptr_btCollisionShape[0x10])
              (this->m_convexA,&local_168);
    fVar15 = (float)extraout_XMM0_Qa_01;
    fVar13 = (float)((ulong)extraout_XMM0_Qa_01 >> 0x20);
    local_1f8.m_floats[0] =
         local_228._12_4_ + fVar9 * local_198 + fVar15 * local_58 + fVar13 * local_68;
    local_1f8.m_floats[1] =
         (float)local_c8 + fVar9 * fStack_194 + fVar15 * fStack_54 + fVar13 * fStack_64;
    local_1f8.m_floats[2] =
         local_c8._4_4_ + fVar9 * local_23c + fVar15 * (float)local_a8 + local_a8._4_4_ * fVar13;
    local_1f8.m_floats[3] = 0.0;
    fVar13 = local_240 * local_250.m_floats[2];
    local_168.m_floats[1] =
         local_250.m_floats[2] * local_b8._4_4_ +
         local_250.m_floats[0] * local_138._4_4_ + local_250.m_floats[1] * local_148._4_4_;
    local_168.m_floats[0] =
         local_250.m_floats[2] * (float)local_b8 +
         local_250.m_floats[0] * (float)local_138 + local_250.m_floats[1] * (float)local_148;
    local_168.m_floats[2] =
         (float)local_118._0_4_ * local_250.m_floats[0] +
         (float)local_128._0_4_ * local_250.m_floats[1] + fVar13;
    local_168.m_floats[3] = 0.0;
    local_188._8_8_ = local_228._8_8_;
    local_188._0_8_ = local_228._8_8_;
    (*(this->m_convexB->super_btCollisionShape)._vptr_btCollisionShape[0x10])
              (this->m_convexB,&local_168);
    bVar4.m_floats = local_250.m_floats;
    fVar15 = (float)extraout_XMM0_Qa_02;
    fVar9 = (float)((ulong)extraout_XMM0_Qa_02 >> 0x20);
    fVar12 = fVar13 * local_78 + fVar15 * local_88 + fVar9 * local_98 + (float)local_228._0_4_;
    fVar14 = fVar13 * fStack_74 + fVar15 * fStack_84 + fVar9 * fStack_94 + (float)local_228._4_4_;
    fVar15 = fVar13 * local_240 + fVar15 * (float)local_b8 + local_b8._4_4_ * fVar9 +
             (float)local_188._0_4_;
    local_218.m_floats[0] = local_1f8.m_floats[0] - fVar12;
    local_218.m_floats[1] = local_1f8.m_floats[1] - fVar14;
    local_158.m_floats[1] = fVar14;
    local_158.m_floats[0] = fVar12;
    local_158.m_floats[2] = fVar15;
    local_158.m_floats[3] = 0.0;
    fVar15 = local_1f8.m_floats[2] - fVar15;
    local_218.m_floats[2] = fVar15;
    local_218.m_floats[3] = 0.0;
    if ((float)local_238 <= 1.0) {
      fVar15 = fVar15 * local_250.m_floats[2] +
               local_218.m_floats[0] * local_250.m_floats[0] +
               local_218.m_floats[1] * local_250.m_floats[1];
      if (0.0 < fVar15) {
        fVar9 = local_250.m_floats[2] * (float)local_1b8._0_4_ +
                local_250.m_floats[0] * (float)local_1a8._0_4_ +
                local_250.m_floats[1] * (float)local_1c8._0_4_;
        if (-1.4210855e-14 <= fVar9) goto LAB_00183ff7;
        local_238._0_4_ = (float)local_238 - fVar15 / fVar9;
        fVar15 = 1.0 - (float)local_238;
        uVar1 = *(undefined8 *)((fromA->m_origin).m_floats + 1);
        uVar2 = *(undefined8 *)((toA->m_origin).m_floats + 1);
        local_c8 = CONCAT44((float)((ulong)uVar1 >> 0x20) * fVar15 +
                            (float)((ulong)uVar2 >> 0x20) * (float)local_238,
                            (float)uVar1 * fVar15 + (float)uVar2 * (float)local_238);
        uStack_c0 = CONCAT44(fVar15 * 0.0 + (float)local_238 * 0.0,
                             fVar15 * 0.0 + (float)local_238 * 0.0);
        uVar1 = *(undefined8 *)((fromB->m_origin).m_floats + 1);
        uVar2 = *(undefined8 *)((local_170->m_origin).m_floats + 1);
        local_228._4_4_ = (float)uVar1 * fVar15 + (float)uVar2 * (float)local_238;
        local_228._0_4_ =
             (fromB->m_origin).m_floats[0] * fVar15 +
             (local_170->m_origin).m_floats[0] * (float)local_238;
        fStack_220 = (float)((ulong)uVar1 >> 0x20) * fVar15 +
                     (float)((ulong)uVar2 >> 0x20) * (float)local_238;
        fStack_21c = (fromA->m_origin).m_floats[0] * fVar15 +
                     (toA->m_origin).m_floats[0] * (float)local_238;
        local_1d8[0] = local_250.m_floats[0];
        local_1d8[1] = local_250.m_floats[1];
        local_1d8[2] = 0.0;
        local_1d8[3] = 0.0;
        local_250.m_floats._8_8_ = bVar4.m_floats._8_8_;
        local_1e8 = local_250.m_floats[2];
        bStack_1e4 = local_250.m_floats[3];
        uStack_1e0 = 0;
      }
      local_250.m_floats = bVar4.m_floats;
      bVar6 = btVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&local_218);
      if (!bVar6) {
        btVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&local_218,&local_1f8,&local_158);
      }
      bVar7 = btVoronoiSimplexSolver::closest(this->m_simplexSolver,&local_250);
      fVar15 = 0.0;
      bVar6 = true;
      if (bVar7) {
        fVar15 = local_250.m_floats[2] * local_250.m_floats[2] +
                 local_250.m_floats[0] * local_250.m_floats[0] +
                 local_250.m_floats[1] * local_250.m_floats[1];
      }
    }
    else {
LAB_00183ff7:
      bVar6 = false;
      fVar15 = (float)local_208;
    }
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool	btSubsimplexConvexCast::calcTimeOfImpact(
		const btTransform& fromA,
		const btTransform& toA,
		const btTransform& fromB,
		const btTransform& toB,
		CastResult& result)
{

	m_simplexSolver->reset();

	btVector3 linVelA,linVelB;
	linVelA = toA.getOrigin()-fromA.getOrigin();
	linVelB = toB.getOrigin()-fromB.getOrigin();

	btScalar lambda = btScalar(0.);

	btTransform interpolatedTransA = fromA;
	btTransform interpolatedTransB = fromB;

	///take relative motion
	btVector3 r = (linVelA-linVelB);
	btVector3 v;
	
	btVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r*fromA.getBasis()));
	btVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r*fromB.getBasis()));
	v = supVertexA-supVertexB;
	int maxIter = MAX_ITERATIONS;

	btVector3 n;
	n.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	
	btVector3 c;

	


	btScalar dist2 = v.length2();
#ifdef BT_USE_DOUBLE_PRECISION
	btScalar epsilon = btScalar(0.0001);
#else
	btScalar epsilon = btScalar(0.0001);
#endif //BT_USE_DOUBLE_PRECISION
	btVector3	w,p;
	btScalar VdotR;
	
	while ( (dist2 > epsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v*interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v*interpolatedTransB.getBasis()));
		w = supVertexA-supVertexB;

		btScalar VdotW = v.dot(w);

		if (lambda > btScalar(1.0))
		{
			return false;
		}

		if ( VdotW > btScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON*SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(),toA.getOrigin(),lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(),toB.getOrigin(),lambda);
				//m_simplexSolver->reset();
				//check next line
				 w = supVertexA-supVertexB;
				
				n = v;
				
			}
		} 
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex( w, supVertexA , supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();
			
			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		} else
		{
			dist2 = btScalar(0.);
		} 
	}

	//int numiter = MAX_ITERATIONS - maxIter;
//	printf("number of iterations: %d", numiter);
	
	//don't report a time of impact when moving 'away' from the hitnormal
	

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON*SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = btVector3(btScalar(0.0), btScalar(0.0), btScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r)>=-result.m_allowedPenetration)
		return false;

	btVector3 hitA,hitB;
	m_simplexSolver->compute_points(hitA,hitB);
	result.m_hitPoint=hitB;
	return true;
}